

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseModuleCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  Module *out_module;
  Stream **ppSVar1;
  undefined1 uVar3;
  ScriptModuleType SVar2;
  undefined1 uVar4;
  WastParseOptions *pWVar5;
  undefined8 uVar6;
  Command *pCVar7;
  undefined4 uVar18;
  _func_int **pp_Var19;
  ScriptModuleType SVar20;
  undefined4 uVar21;
  Command *pCVar22;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> _Var23;
  pointer pEVar24;
  Result RVar25;
  Result RVar26;
  Index IVar27;
  pointer pEVar28;
  long lVar29;
  unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> command;
  unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_> script_module;
  ReadBinaryOptions options;
  Errors errors;
  Command *local_b0;
  _Head_base<0UL,_wabt::ScriptModule_*,_false> local_a0;
  Command *local_98;
  CommandPtr *local_90;
  ReadBinaryOptions local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  Errors local_48;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined5 uVar10;
  undefined1 uVar11;
  undefined4 uVar12;
  undefined1 uVar13;
  undefined3 uVar14;
  undefined1 uVar15;
  undefined2 uVar16;
  undefined1 uVar17;
  
  pCVar22 = local_b0;
  local_a0._M_head_impl = (ScriptModule *)0x0;
  RVar25 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                   *)&local_a0);
  RVar26.enum_ = Error;
  if (RVar25.enum_ != Error) {
    MakeUnique<wabt::ModuleCommand>();
    _Var23._M_head_impl = local_a0._M_head_impl;
    SVar2 = (local_a0._M_head_impl)->type_;
    if (SVar2 == Quoted) {
      ppSVar1 = &local_88.log_stream;
      local_88.features._0_2_ = SUB82(ppSVar1,0);
      local_88.features._2_2_ = SUB82((ulong)ppSVar1 >> 0x10,0);
      local_88.features._4_4_ = SUB84((ulong)ppSVar1 >> 0x20,0);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a binary module","");
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"a text module","");
      local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_88,&local_48);
      lVar29 = 0;
      RVar26 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_48,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      do {
        if (local_58 + lVar29 != *(undefined1 **)((long)local_68 + lVar29)) {
          operator_delete(*(undefined1 **)((long)local_68 + lVar29));
        }
        lVar29 = lVar29 + -0x20;
      } while (lVar29 != -0x40);
    }
    else {
      out_module = (Module *)(local_b0 + 1);
      if (SVar2 == Binary) {
        local_88.log_stream = (Stream *)0x0;
        local_88._24_3_ = 0x10100;
        pWVar5 = this->options_;
        uVar18._0_1_ = (pWVar5->features).bulk_memory_enabled_;
        uVar18._1_1_ = (pWVar5->features).reference_types_enabled_;
        uVar3 = (pWVar5->features).annotations_enabled_;
        uVar4 = (pWVar5->features).gc_enabled_;
        uVar18._2_2_ = CONCAT11(uVar4,uVar3);
        local_88.features._8_2_ = SUB42(uVar18,0);
        uVar6._0_1_ = (pWVar5->features).exceptions_enabled_;
        uVar6._1_1_ = (pWVar5->features).mutable_globals_enabled_;
        uVar8 = (pWVar5->features).sat_float_to_int_enabled_;
        uVar9 = (pWVar5->features).sign_extension_enabled_;
        uVar11 = (pWVar5->features).simd_enabled_;
        uVar13 = (pWVar5->features).threads_enabled_;
        uVar15 = (pWVar5->features).multi_value_enabled_;
        uVar17 = (pWVar5->features).tail_call_enabled_;
        uVar16 = CONCAT11(uVar17,uVar15);
        uVar14 = CONCAT21(uVar16,uVar13);
        uVar12 = CONCAT31(uVar14,uVar11);
        uVar10 = CONCAT41(uVar12,uVar9);
        uVar6._2_6_ = CONCAT51(uVar10,uVar8);
        local_88.features._0_2_ = SUB82(uVar6,0);
        local_88.features._2_2_ = SUB62(uVar6._2_6_,0);
        local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_90 = out_command;
        local_88.features._4_4_ = uVar12;
        local_88.features._10_2_ = uVar18._2_2_;
        ReadBinaryIr("<text>",local_a0._M_head_impl[5]._vptr_ScriptModule,
                     *(long *)&local_a0._M_head_impl[5].type_ -
                     (long)local_a0._M_head_impl[5]._vptr_ScriptModule,&local_88,&local_48,
                     out_module);
        local_98 = local_b0;
        std::__cxx11::string::_M_assign((string *)(local_b0 + 3));
        pEVar24 = local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pp_Var19 = _Var23._M_head_impl[1]._vptr_ScriptModule;
        SVar20 = _Var23._M_head_impl[1].type_;
        uVar21 = *(undefined4 *)&_Var23._M_head_impl[1].field_0xc;
        SVar2 = _Var23._M_head_impl[2].type_;
        uVar18 = *(undefined4 *)&_Var23._M_head_impl[2].field_0xc;
        local_b0[2]._vptr_Command = _Var23._M_head_impl[2]._vptr_ScriptModule;
        local_b0[2].type = SVar2;
        *(undefined4 *)&local_b0[2].field_0xc = uVar18;
        (out_module->loc).filename.data_ = (char *)pp_Var19;
        local_b0[1].type = SVar20;
        *(undefined4 *)&local_b0[1].field_0xc = uVar21;
        for (pEVar28 = local_48.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                       _M_impl.super__Vector_impl_data._M_start; pEVar28 != pEVar24;
            pEVar28 = pEVar28 + 1) {
          if (pEVar28->error_level != Error) {
            __assert_fail("error.error_level == ErrorLevel::Error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                          ,0xb03,
                          "Result wabt::WastParser::ParseModuleCommand(Script *, CommandPtr *)");
          }
          if ((pEVar28->loc).field_1.field_1.offset == 0xffffffffffffffff) {
            Error(this,0x19afd2,(pEVar28->message)._M_dataplus._M_p);
          }
          else {
            Error(this,0x19afed,(char *)(pEVar28->loc).field_1.field_1.offset,
                  (pEVar28->message)._M_dataplus._M_p);
          }
        }
        std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_48);
        out_command = local_90;
      }
      else {
        local_98 = local_b0;
        if (SVar2 == Text) {
          Module::operator=(out_module,(Module *)(local_a0._M_head_impl + 1));
        }
      }
      if (script != (Script *)0x0) {
        IVar27 = (Index)((ulong)((long)(script->commands).
                                       super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(script->commands).
                                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
        if (*(long *)&local_98[3].type != 0) {
          uVar18 = *(undefined4 *)&(out_module->loc).filename.data_;
          local_88.features._4_4_ = *(undefined4 *)((long)&local_b0[1]._vptr_Command + 4);
          local_88._12_4_ = *(undefined4 *)&local_b0[1].field_0xc;
          local_88.log_stream = (Stream *)local_b0[2]._vptr_Command;
          local_88._24_4_ = local_b0[2].type;
          local_88._28_4_ = *(undefined4 *)&local_b0[2].field_0xc;
          local_88.features._0_2_ = SUB42(uVar18,0);
          local_88.features._2_2_ = SUB42((uint)uVar18 >> 0x10,0);
          local_88.features._8_2_ = SUB42(local_b0[1].type,0);
          local_88.features._10_2_ = SUB42(local_b0[1].type >> 0x10,0);
          local_68[0] = (undefined1 *)CONCAT44(local_68[0]._4_4_,IVar27);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
          ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                      *)&script->module_bindings,0,local_98 + 3);
        }
        this->last_module_index_ = IVar27;
      }
      local_b0 = (Command *)0x0;
      pCVar7 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar22;
      RVar26.enum_ = Ok;
      if (pCVar7 != (Command *)0x0) {
        (*pCVar7->_vptr_Command[1])();
        RVar26.enum_ = Ok;
      }
    }
    if (local_b0 != (Command *)0x0) {
      (*local_b0->_vptr_Command[1])();
    }
  }
  if (local_a0._M_head_impl != (ScriptModule *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_ScriptModule[1])();
  }
  return (Result)RVar26.enum_;
}

Assistant:

Result WastParser::ParseModuleCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseModuleCommand);
  std::unique_ptr<ScriptModule> script_module;
  CHECK_RESULT(ParseScriptModule(&script_module));

  auto command = MakeUnique<ModuleCommand>();
  Module& module = command->module;

  switch (script_module->type()) {
    case ScriptModuleType::Text:
      module = std::move(cast<TextScriptModule>(script_module.get())->module);
      break;

    case ScriptModuleType::Binary: {
      auto* bsm = cast<BinaryScriptModule>(script_module.get());
      ReadBinaryOptions options;
#if WABT_TRACING
      auto log_stream = FileStream::CreateStdout();
      options.log_stream = log_stream.get();
#endif
      options.features = options_->features;
      Errors errors;
      const char* filename = "<text>";
      ReadBinaryIr(filename, bsm->data.data(), bsm->data.size(), options,
                   &errors, &module);
      module.name = bsm->name;
      module.loc = bsm->loc;
      for (const auto& error: errors) {
        assert(error.error_level == ErrorLevel::Error);
        if (error.loc.offset == kInvalidOffset) {
          Error(bsm->loc, "error in binary module: %s", error.message.c_str());
        } else {
          Error(bsm->loc, "error in binary module: @0x%08" PRIzx ": %s",
                error.loc.offset, error.message.c_str());
        }
      }
      break;
    }

    case ScriptModuleType::Quoted:
      return ErrorExpected({"a binary module", "a text module"});
  }

  // script is nullptr when ParseModuleCommand is called from ParseModule.
  if (script) {
    Index command_index = script->commands.size();

    if (!module.name.empty()) {
      script->module_bindings.emplace(module.name,
                                      Binding(module.loc, command_index));
    }

    last_module_index_ = command_index;
  }

  *out_command = std::move(command);
  return Result::Ok;
}